

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_pointcloud.cpp
# Opt level: O1

ON_PointCloud *
ON_PointCloud::RandomSubsample
          (ON_PointCloud *source_point_cloud,uint subsample_point_count,
          ON_PointCloud *destination_point_cloud,ON_ProgressReporter *progress_reporter,
          ON_Terminator *terminator)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  anon_union_4_2_6147a14e_for_ON_Color_15 aVar6;
  ON_3dPoint *pOVar7;
  double dVar8;
  ON_3dVector *pOVar9;
  ON_Color *pOVar10;
  double *pdVar11;
  bool *pbVar12;
  uint uVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  bool bVar17;
  ON__UINT32 OVar18;
  ON_PointCloud *this;
  ulong uVar19;
  uint uVar20;
  ulong uVar21;
  uint uVar22;
  ON_3dVector t;
  ON_RandomNumberGenerator gen;
  ON_RandomNumberGenerator local_9f4;
  
  if (subsample_point_count != 0 && source_point_cloud != (ON_PointCloud *)0x0) {
    uVar1 = (source_point_cloud->m_P).super_ON_SimpleArray<ON_3dPoint>.m_count;
    if (subsample_point_count <= uVar1 && uVar1 - subsample_point_count != 0) {
      uVar2 = (source_point_cloud->m_N).m_count;
      uVar3 = (source_point_cloud->m_C).m_count;
      uVar4 = (source_point_cloud->m_V).m_count;
      uVar5 = (source_point_cloud->m_H).m_count;
      if (destination_point_cloud == (ON_PointCloud *)0x0) {
        this = (ON_PointCloud *)operator_new(0x148);
        ON_PointCloud(this,source_point_cloud);
      }
      else {
        this = destination_point_cloud;
        if (source_point_cloud != destination_point_cloud) {
          Destroy(destination_point_cloud);
          operator=(destination_point_cloud,source_point_cloud);
        }
      }
      ON_RandomNumberGenerator::ON_RandomNumberGenerator(&local_9f4);
      ON_RandomNumberGenerator::Seed(&local_9f4);
      if (uVar1 != subsample_point_count) {
        uVar22 = 0;
        uVar20 = uVar1;
        do {
          uVar13 = uVar20 - 1;
          if ((terminator != (ON_Terminator *)0x0) &&
             (bVar17 = ON_Terminator::TerminationRequested(terminator), bVar17)) {
            if (this != source_point_cloud) {
              Destroy(this);
            }
            if (destination_point_cloud != (ON_PointCloud *)0x0) {
              return (ON_PointCloud *)0x0;
            }
            (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[4])(this);
            return (ON_PointCloud *)0x0;
          }
          if (progress_reporter != (ON_ProgressReporter *)0x0) {
            ON_ProgressReporter::ReportProgress
                      (progress_reporter,(double)uVar22 / (double)(uVar1 - subsample_point_count));
          }
          OVar18 = ON_RandomNumberGenerator::RandomNumber(&local_9f4);
          uVar20 = OVar18 % uVar20;
          if (uVar13 != uVar20) {
            pOVar7 = (this->m_P).super_ON_SimpleArray<ON_3dPoint>.m_a;
            dVar8 = pOVar7[(int)uVar20].z;
            dVar14 = pOVar7[(int)uVar20].x;
            dVar15 = pOVar7[(int)uVar20].y;
            dVar16 = pOVar7[(int)uVar13].y;
            pOVar7[(int)uVar20].x = pOVar7[(int)uVar13].x;
            pOVar7[(int)uVar20].y = dVar16;
            pOVar7[(int)uVar20].z = pOVar7[(int)uVar13].z;
            pOVar7 = (this->m_P).super_ON_SimpleArray<ON_3dPoint>.m_a;
            pOVar7[(int)uVar13].z = dVar8;
            pOVar7 = pOVar7 + (int)uVar13;
            pOVar7->x = dVar14;
            pOVar7->y = dVar15;
          }
          if (uVar1 == uVar2 && uVar13 != uVar20) {
            pOVar9 = (this->m_N).m_a;
            dVar8 = pOVar9[(int)uVar20].z;
            dVar14 = pOVar9[(int)uVar20].x;
            dVar15 = pOVar9[(int)uVar20].y;
            dVar16 = pOVar9[(int)uVar13].y;
            pOVar9[(int)uVar20].x = pOVar9[(int)uVar13].x;
            pOVar9[(int)uVar20].y = dVar16;
            pOVar9[(int)uVar20].z = pOVar9[(int)uVar13].z;
            pOVar9 = (this->m_N).m_a;
            pOVar9[(int)uVar13].z = dVar8;
            pOVar9 = pOVar9 + (int)uVar13;
            pOVar9->x = dVar14;
            pOVar9->y = dVar15;
          }
          if (uVar1 == uVar3 && uVar13 != uVar20) {
            pOVar10 = (this->m_C).m_a;
            aVar6 = pOVar10[(int)uVar20].field_0;
            pOVar10[(int)uVar20].field_0 = pOVar10[(int)uVar13].field_0;
            (this->m_C).m_a[(int)uVar13].field_0 = aVar6;
          }
          if (uVar1 == uVar4 && uVar13 != uVar20) {
            pdVar11 = (this->m_V).m_a;
            dVar8 = pdVar11[(int)uVar20];
            pdVar11[(int)uVar20] = pdVar11[(int)uVar13];
            pdVar11[(int)uVar13] = dVar8;
          }
          if (uVar1 == uVar5 && uVar13 != uVar20) {
            pbVar12 = (this->m_H).m_a;
            bVar17 = pbVar12[(int)uVar20];
            pbVar12[(int)uVar20] = pbVar12[(int)uVar13];
            pbVar12[(int)uVar13] = bVar17;
          }
        } while ((uVar13 != 0) &&
                (uVar22 = uVar22 + 1, uVar20 = uVar13, subsample_point_count != uVar13));
      }
      if (progress_reporter != (ON_ProgressReporter *)0x0) {
        ON_ProgressReporter::ReportProgress(progress_reporter,1.0);
      }
      if ((-1 < (int)subsample_point_count) &&
         ((int)subsample_point_count <= (this->m_P).super_ON_SimpleArray<ON_3dPoint>.m_capacity)) {
        (this->m_P).super_ON_SimpleArray<ON_3dPoint>.m_count = subsample_point_count;
      }
      ON_SimpleArray<ON_3dPoint>::SetCapacity
                (&(this->m_P).super_ON_SimpleArray<ON_3dPoint>,
                 (long)(this->m_P).super_ON_SimpleArray<ON_3dPoint>.m_count);
      if (uVar1 == uVar2) {
        if ((-1 < (int)subsample_point_count) &&
           ((int)subsample_point_count <= (this->m_N).m_capacity)) {
          (this->m_N).m_count = subsample_point_count;
        }
        ON_SimpleArray<ON_3dVector>::SetCapacity(&this->m_N,(long)(this->m_N).m_count);
      }
      if (uVar1 == uVar3) {
        if ((-1 < (int)subsample_point_count) &&
           ((int)subsample_point_count <= (this->m_C).m_capacity)) {
          (this->m_C).m_count = subsample_point_count;
        }
        ON_SimpleArray<ON_Color>::SetCapacity(&this->m_C,(long)(this->m_C).m_count);
      }
      if (uVar1 == uVar4) {
        if ((-1 < (int)subsample_point_count) &&
           ((int)subsample_point_count <= (this->m_V).m_capacity)) {
          (this->m_V).m_count = subsample_point_count;
        }
        ON_SimpleArray<double>::SetCapacity(&this->m_V,(long)(this->m_V).m_count);
      }
      if (uVar1 == uVar5) {
        if ((-1 < (int)subsample_point_count) &&
           ((int)subsample_point_count <= (this->m_H).m_capacity)) {
          (this->m_H).m_count = subsample_point_count;
        }
        ON_SimpleArray<bool>::SetCapacity(&this->m_H,(long)(this->m_H).m_count);
        this->m_hidden_count = 0;
        uVar19 = (ulong)(uint)(this->m_H).m_count;
        if (uVar19 != 0) {
          pbVar12 = (this->m_H).m_a;
          uVar21 = 0;
          do {
            if (pbVar12[uVar21] == true) {
              this->m_hidden_count = this->m_hidden_count + 1;
            }
            uVar21 = uVar21 + 1;
          } while (uVar19 != uVar21);
          return this;
        }
        return this;
      }
      return this;
    }
  }
  return (ON_PointCloud *)0x0;
}

Assistant:

ON_PointCloud* ON_PointCloud::RandomSubsample(
  const ON_PointCloud* source_point_cloud,
  const unsigned int subsample_point_count,
  ON_PointCloud* destination_point_cloud,
  ON_ProgressReporter* progress_reporter,
  ON_Terminator* terminator
)
{
  if (
       nullptr == source_point_cloud 
    || subsample_point_count <= 0 
    || subsample_point_count >= source_point_cloud->m_P.UnsignedCount()
    )
    return nullptr;

  const unsigned int point_count = source_point_cloud->m_P.UnsignedCount();
  const unsigned int points_to_remove = point_count - subsample_point_count;
  if (points_to_remove <= 0)
    return nullptr;

  const bool bHaveNormals = point_count == source_point_cloud->m_N.UnsignedCount();
  const bool bHaveColors = point_count == source_point_cloud->m_C.UnsignedCount();
  const bool bHaveValues = point_count == source_point_cloud->m_V.UnsignedCount();
  const bool bHaveHidden = point_count == source_point_cloud->m_H.UnsignedCount();

  bool bAlloc = false;
  if (destination_point_cloud)
  {
    if (source_point_cloud != destination_point_cloud)
    {
      destination_point_cloud->Destroy();
      *destination_point_cloud = *source_point_cloud;
    }
  }
  else
  {
    destination_point_cloud = new ON_PointCloud(*source_point_cloud);
    bAlloc = true;
  }

  ON_RandomNumberGenerator gen;
  gen.Seed();

  unsigned int last_point_count = point_count;
  for (unsigned int i = 0; i < points_to_remove; i++)
  {
    if (terminator && ON_Terminator::TerminationRequested(terminator))
    {
      if (source_point_cloud != destination_point_cloud)
        destination_point_cloud->Destroy();
      if (bAlloc)
        delete destination_point_cloud;
      return nullptr;
    }

    if (progress_reporter)
      ON_ProgressReporter::ReportProgress(progress_reporter, i / (double)points_to_remove);

    // For (min <= r < max): min + RandomNumber() % (max-min)
    const int point_index = gen.RandomNumber() % last_point_count;

    destination_point_cloud->m_P.Swap(point_index, last_point_count - 1);
    if (bHaveNormals)
      destination_point_cloud->m_N.Swap(point_index, last_point_count - 1);
    if (bHaveColors)
      destination_point_cloud->m_C.Swap(point_index, last_point_count - 1);
    if (bHaveValues)
      destination_point_cloud->m_V.Swap(point_index, last_point_count - 1);
    if (bHaveHidden)
      destination_point_cloud->m_H.Swap(point_index, last_point_count - 1);

    last_point_count--;
    if (last_point_count <= 0)
      break;
  }

  if (progress_reporter)
    ON_ProgressReporter::ReportProgress(progress_reporter, 1.0);

  destination_point_cloud->m_P.SetCount(subsample_point_count);
  destination_point_cloud->m_P.Shrink();
  if (bHaveNormals)
  {
    destination_point_cloud->m_N.SetCount(subsample_point_count);
    destination_point_cloud->m_N.Shrink();
  }
  if (bHaveColors)
  {
    destination_point_cloud->m_C.SetCount(subsample_point_count);
    destination_point_cloud->m_C.Shrink();
  }
  if (bHaveValues)
  {
    destination_point_cloud->m_V.SetCount(subsample_point_count);
    destination_point_cloud->m_V.Shrink();
  }
  if (bHaveHidden)
  {
    destination_point_cloud->m_H.SetCount(subsample_point_count);
    destination_point_cloud->m_H.Shrink();
    destination_point_cloud->m_hidden_count = 0;
    for (unsigned int i = 0; i < destination_point_cloud->m_H.UnsignedCount(); i++)
    {
      if (destination_point_cloud->m_H[i])
        destination_point_cloud->m_hidden_count++;
    }
  }

  return destination_point_cloud;
}